

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

void arena_stats_merge(tsdn_t *tsdn,arena_t *arena,uint *nthreads,char **dss,ssize_t *dirty_decay_ms
                      ,ssize_t *muzzy_decay_ms,size_t *nactive,size_t *ndirty,size_t *nmuzzy,
                      arena_stats_t *astats,bin_stats_t *bstats,arena_stats_large_t *lstats,
                      arena_stats_extents_t *estats)

{
  size_t sVar1;
  uint64_t uVar2;
  size_t sVar3;
  size_t sVar4;
  uint64_t src;
  uint64_t uVar5;
  long lVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  arena_t *in_RSI;
  tsdn_t *in_RDI;
  bin_stats_t *in_stack_00000008;
  tsdn_t *in_stack_00000010;
  malloc_mutex_t *in_stack_00000018;
  atomic_zu_t *in_stack_00000020;
  long in_stack_00000030;
  long in_stack_00000038;
  uint j;
  szind_t i_3;
  cache_bin_t *tbin_1;
  cache_bin_t *tbin;
  szind_t i_2;
  cache_bin_array_descriptor_t *descriptor;
  size_t retained_bytes;
  size_t muzzy_bytes;
  size_t dirty_bytes;
  size_t retained;
  size_t muzzy;
  size_t dirty;
  pszind_t i_1;
  size_t curlextents;
  uint64_t nflush;
  uint64_t nrequests;
  uint64_t ndalloc;
  uint64_t nmalloc;
  szind_t i;
  size_t metadata_thp;
  size_t base_mapped;
  size_t base_resident;
  size_t base_allocated;
  size_t result_1;
  size_t result;
  size_t ret;
  size_t ret_1;
  size_t ret_2;
  tsdn_t *in_stack_fffffffffffffc20;
  base_t *in_stack_fffffffffffffc28;
  undefined4 in_stack_fffffffffffffc30;
  undefined4 in_stack_fffffffffffffc34;
  undefined4 uVar13;
  arena_t *in_stack_fffffffffffffc38;
  tsdn_t *tsdn_00;
  tsdn_t *in_stack_fffffffffffffc40;
  size_t *in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc7c;
  size_t *in_stack_fffffffffffffc80;
  uint uStack_268;
  uint uStack_264;
  uint uStack_24c;
  base_t *pbStack_248;
  uint uStack_20c;
  uint uStack_1dc;
  size_t local_1d8;
  long local_1d0;
  long local_1c8;
  size_t local_1c0;
  
  arena_basic_stats_merge
            (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
             (uint *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
             (char **)in_stack_fffffffffffffc28,(ssize_t *)in_stack_fffffffffffffc20,
             (ssize_t *)in_stack_00000018,in_stack_fffffffffffffc70,
             (size_t *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
             in_stack_fffffffffffffc80);
  base_stats_get((tsdn_t *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                 in_stack_fffffffffffffc28,(size_t *)in_stack_fffffffffffffc20,
                 (size_t *)in_stack_00000018,(size_t *)in_stack_00000010,&in_stack_00000008->nmalloc
                );
  arena_stats_lock(in_RDI,&in_RSI->stats);
  sVar1 = arena_stats_read_zu(in_RDI,&in_RSI->stats,&(in_RSI->stats).mapped);
  arena_stats_accum_zu(in_stack_00000020,local_1d0 + sVar1);
  sVar1 = extents_npages_get(&in_RSI->extents_retained);
  arena_stats_accum_zu(in_stack_00000020 + 1,sVar1 << 0xc);
  in_stack_00000020[2].repr = (in_RSI->extent_avail_cnt).repr;
  uVar2 = arena_stats_read_u64(in_RDI,&in_RSI->stats,&(in_RSI->stats).decay_dirty.npurge);
  arena_stats_accum_u64((arena_stats_u64_t *)(in_stack_00000020 + 3),uVar2);
  uVar2 = arena_stats_read_u64(in_RDI,&in_RSI->stats,&(in_RSI->stats).decay_dirty.nmadvise);
  arena_stats_accum_u64((arena_stats_u64_t *)(in_stack_00000020 + 4),uVar2);
  uVar2 = arena_stats_read_u64(in_RDI,&in_RSI->stats,&(in_RSI->stats).decay_dirty.purged);
  arena_stats_accum_u64((arena_stats_u64_t *)(in_stack_00000020 + 5),uVar2);
  uVar2 = arena_stats_read_u64(in_RDI,&in_RSI->stats,&(in_RSI->stats).decay_muzzy.npurge);
  arena_stats_accum_u64((arena_stats_u64_t *)(in_stack_00000020 + 6),uVar2);
  uVar2 = arena_stats_read_u64(in_RDI,&in_RSI->stats,&(in_RSI->stats).decay_muzzy.nmadvise);
  arena_stats_accum_u64((arena_stats_u64_t *)(in_stack_00000020 + 7),uVar2);
  uVar2 = arena_stats_read_u64(in_RDI,&in_RSI->stats,&(in_RSI->stats).decay_muzzy.purged);
  arena_stats_accum_u64((arena_stats_u64_t *)(in_stack_00000020 + 8),uVar2);
  arena_stats_accum_zu(in_stack_00000020 + 9,local_1c0);
  sVar1 = arena_internal_get(in_RSI);
  arena_stats_accum_zu(in_stack_00000020 + 10,sVar1);
  arena_stats_accum_zu(in_stack_00000020 + 0xc,local_1d8);
  sVar1 = (in_RSI->nactive).repr;
  sVar3 = extents_npages_get(&in_RSI->extents_dirty);
  sVar4 = extents_npages_get(&in_RSI->extents_muzzy);
  arena_stats_accum_zu(in_stack_00000020 + 0xb,local_1c8 + (sVar1 + sVar3 + sVar4) * 0x1000);
  for (uStack_1dc = 0; uStack_1dc < 0xc4; uStack_1dc = uStack_1dc + 1) {
    uVar2 = arena_stats_read_u64(in_RDI,&in_RSI->stats,&(in_RSI->stats).lstats[uStack_1dc].nmalloc);
    arena_stats_accum_u64((arena_stats_u64_t *)(in_stack_00000030 + (ulong)uStack_1dc * 0x30),uVar2)
    ;
    arena_stats_accum_u64((arena_stats_u64_t *)(in_stack_00000020 + 0xe),uVar2);
    src = arena_stats_read_u64(in_RDI,&in_RSI->stats,&(in_RSI->stats).lstats[uStack_1dc].ndalloc);
    arena_stats_accum_u64
              ((arena_stats_u64_t *)(in_stack_00000030 + (ulong)uStack_1dc * 0x30 + 8),src);
    arena_stats_accum_u64((arena_stats_u64_t *)(in_stack_00000020 + 0xf),src);
    uVar5 = arena_stats_read_u64
                      (in_RDI,&in_RSI->stats,&(in_RSI->stats).lstats[uStack_1dc].nrequests);
    arena_stats_accum_u64
              ((arena_stats_u64_t *)(in_stack_00000030 + (ulong)uStack_1dc * 0x30 + 0x10),
               uVar2 + uVar5);
    arena_stats_accum_u64((arena_stats_u64_t *)(in_stack_00000020 + 0x12),uVar2 + uVar5);
    arena_stats_accum_u64
              ((arena_stats_u64_t *)(in_stack_00000030 + (ulong)uStack_1dc * 0x30 + 0x18),uVar2);
    arena_stats_accum_u64((arena_stats_u64_t *)(in_stack_00000020 + 0x10),uVar2);
    uVar5 = arena_stats_read_u64(in_RDI,&in_RSI->stats,&(in_RSI->stats).lstats[uStack_1dc].nflushes)
    ;
    arena_stats_accum_u64
              ((arena_stats_u64_t *)(in_stack_00000030 + (ulong)uStack_1dc * 0x30 + 0x20),uVar5);
    arena_stats_accum_u64((arena_stats_u64_t *)(in_stack_00000020 + 0x11),uVar5);
    lVar6 = in_stack_00000030 + (ulong)uStack_1dc * 0x30;
    *(uint64_t *)(lVar6 + 0x28) = (uVar2 - src) + *(long *)(lVar6 + 0x28);
    arena_stats_accum_zu
              (in_stack_00000020 + 0xd,(uVar2 - src) * sz_index2size_tab[uStack_1dc + 0x24]);
  }
  for (uStack_20c = 0; uStack_20c < 199; uStack_20c = uStack_20c + 1) {
    uVar7 = func_0x0010ecf0(&in_RSI->extents_dirty,uStack_20c);
    uVar8 = func_0x0010ecf0(&in_RSI->extents_muzzy,uStack_20c);
    uVar9 = func_0x0010ecf0(&in_RSI->extents_retained,uStack_20c);
    uVar10 = func_0x0010e5f0(&in_RSI->extents_dirty,uStack_20c);
    uVar11 = func_0x0010e5f0(&in_RSI->extents_muzzy,uStack_20c);
    uVar12 = func_0x0010e5f0(&in_RSI->extents_retained,uStack_20c);
    *(undefined8 *)(in_stack_00000038 + (ulong)uStack_20c * 0x30) = uVar7;
    *(undefined8 *)(in_stack_00000038 + 0x10 + (ulong)uStack_20c * 0x30) = uVar8;
    *(undefined8 *)(in_stack_00000038 + 0x20 + (ulong)uStack_20c * 0x30) = uVar9;
    *(undefined8 *)(in_stack_00000038 + 8 + (ulong)uStack_20c * 0x30) = uVar10;
    *(undefined8 *)(in_stack_00000038 + 0x18 + (ulong)uStack_20c * 0x30) = uVar11;
    *(undefined8 *)(in_stack_00000038 + 0x28 + (ulong)uStack_20c * 0x30) = uVar12;
  }
  arena_stats_unlock(in_RDI,&in_RSI->stats);
  tsdn_00 = (tsdn_t *)(in_stack_00000020 + 0x13);
  uVar13 = 0;
  (tsdn_00->tsd).state = '\0';
  (tsdn_00->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled = false;
  (tsdn_00->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arenas_tdata_bypass = false;
  (tsdn_00->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level = '\0';
  (tsdn_00->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_narenas_tdata = 0;
  malloc_mutex_lock((tsdn_t *)in_stack_fffffffffffffc28,(malloc_mutex_t *)in_stack_fffffffffffffc20)
  ;
  pbStack_248 = (base_t *)(in_RSI->cache_bin_array_descriptor_ql).qlh_first;
  while (pbStack_248 != (base_t *)0x0) {
    for (uStack_24c = 0; uStack_24c < 0x24; uStack_24c = uStack_24c + 1) {
      arena_stats_accum_zu
                (in_stack_00000020 + 0x13,
                 (long)((cache_bin_t *)(pbStack_248->mtx).field_0.witness.name)[uStack_24c].ncached
                 * sz_index2size_tab[uStack_24c]);
    }
    for (; uStack_24c < nhbins; uStack_24c = uStack_24c + 1) {
      arena_stats_accum_zu
                (in_stack_00000020 + 0x13,
                 (long)((cache_bin_t *)(pbStack_248->mtx).field_0.field_0.prof_data.max_wait_time.ns
                       )[uStack_24c].ncached * sz_index2size_tab[uStack_24c]);
    }
    if (*(cache_bin_array_descriptor_t **)pbStack_248 ==
        (in_RSI->cache_bin_array_descriptor_ql).qlh_first) {
      in_stack_fffffffffffffc28 = (base_t *)0x0;
      pbStack_248 = in_stack_fffffffffffffc28;
    }
    else {
      in_stack_fffffffffffffc28 = *(base_t **)pbStack_248;
      pbStack_248 = in_stack_fffffffffffffc28;
    }
  }
  malloc_mutex_prof_read
            (tsdn_00,(mutex_prof_data_t *)CONCAT44(uVar13,in_stack_fffffffffffffc30),
             (malloc_mutex_t *)in_stack_fffffffffffffc28);
  malloc_mutex_unlock(in_stack_fffffffffffffc20,in_stack_00000018);
  malloc_mutex_lock((tsdn_t *)in_stack_fffffffffffffc28,(malloc_mutex_t *)in_stack_fffffffffffffc20)
  ;
  malloc_mutex_prof_read
            (tsdn_00,(mutex_prof_data_t *)CONCAT44(uVar13,in_stack_fffffffffffffc30),
             (malloc_mutex_t *)in_stack_fffffffffffffc28);
  malloc_mutex_unlock(in_stack_fffffffffffffc20,in_stack_00000018);
  malloc_mutex_lock((tsdn_t *)in_stack_fffffffffffffc28,(malloc_mutex_t *)in_stack_fffffffffffffc20)
  ;
  malloc_mutex_prof_read
            (tsdn_00,(mutex_prof_data_t *)CONCAT44(uVar13,in_stack_fffffffffffffc30),
             (malloc_mutex_t *)in_stack_fffffffffffffc28);
  malloc_mutex_unlock(in_stack_fffffffffffffc20,in_stack_00000018);
  malloc_mutex_lock((tsdn_t *)in_stack_fffffffffffffc28,(malloc_mutex_t *)in_stack_fffffffffffffc20)
  ;
  malloc_mutex_prof_read
            (tsdn_00,(mutex_prof_data_t *)CONCAT44(uVar13,in_stack_fffffffffffffc30),
             (malloc_mutex_t *)in_stack_fffffffffffffc28);
  malloc_mutex_unlock(in_stack_fffffffffffffc20,in_stack_00000018);
  malloc_mutex_lock((tsdn_t *)in_stack_fffffffffffffc28,(malloc_mutex_t *)in_stack_fffffffffffffc20)
  ;
  malloc_mutex_prof_read
            (tsdn_00,(mutex_prof_data_t *)CONCAT44(uVar13,in_stack_fffffffffffffc30),
             (malloc_mutex_t *)in_stack_fffffffffffffc28);
  malloc_mutex_unlock(in_stack_fffffffffffffc20,in_stack_00000018);
  malloc_mutex_lock((tsdn_t *)in_stack_fffffffffffffc28,(malloc_mutex_t *)in_stack_fffffffffffffc20)
  ;
  malloc_mutex_prof_read
            (tsdn_00,(mutex_prof_data_t *)CONCAT44(uVar13,in_stack_fffffffffffffc30),
             (malloc_mutex_t *)in_stack_fffffffffffffc28);
  malloc_mutex_unlock(in_stack_fffffffffffffc20,in_stack_00000018);
  malloc_mutex_lock((tsdn_t *)in_stack_fffffffffffffc28,(malloc_mutex_t *)in_stack_fffffffffffffc20)
  ;
  malloc_mutex_prof_read
            (tsdn_00,(mutex_prof_data_t *)CONCAT44(uVar13,in_stack_fffffffffffffc30),
             (malloc_mutex_t *)in_stack_fffffffffffffc28);
  malloc_mutex_unlock(in_stack_fffffffffffffc20,in_stack_00000018);
  malloc_mutex_lock((tsdn_t *)in_stack_fffffffffffffc28,(malloc_mutex_t *)in_stack_fffffffffffffc20)
  ;
  malloc_mutex_prof_read
            (tsdn_00,(mutex_prof_data_t *)CONCAT44(uVar13,in_stack_fffffffffffffc30),
             (malloc_mutex_t *)in_stack_fffffffffffffc28);
  malloc_mutex_unlock(in_stack_fffffffffffffc20,in_stack_00000018);
  malloc_mutex_lock((tsdn_t *)in_stack_fffffffffffffc28,(malloc_mutex_t *)in_stack_fffffffffffffc20)
  ;
  malloc_mutex_prof_read
            (tsdn_00,(mutex_prof_data_t *)CONCAT44(uVar13,in_stack_fffffffffffffc30),
             (malloc_mutex_t *)in_stack_fffffffffffffc28);
  malloc_mutex_unlock(in_stack_fffffffffffffc20,in_stack_00000018);
  nstime_copy((nstime_t *)(in_stack_00000020 + 0x4f4),&in_RSI->create_time);
  nstime_update_impl((nstime_t *)in_stack_00000008);
  nstime_subtract((nstime_t *)(in_stack_00000020 + 0x4f4),&in_RSI->create_time);
  for (uStack_264 = 0; uStack_264 < 0x24; uStack_264 = uStack_264 + 1) {
    for (uStack_268 = 0; uStack_268 < bin_infos[uStack_264].n_shards; uStack_268 = uStack_268 + 1) {
      bin_stats_merge(in_stack_00000010,in_stack_00000008,(bin_t *)&UNK_00111331);
    }
  }
  return;
}

Assistant:

void
arena_stats_merge(tsdn_t *tsdn, arena_t *arena, unsigned *nthreads,
    const char **dss, ssize_t *dirty_decay_ms, ssize_t *muzzy_decay_ms,
    size_t *nactive, size_t *ndirty, size_t *nmuzzy, arena_stats_t *astats,
    bin_stats_t *bstats, arena_stats_large_t *lstats,
    arena_stats_extents_t *estats) {
	cassert(config_stats);

	arena_basic_stats_merge(tsdn, arena, nthreads, dss, dirty_decay_ms,
	    muzzy_decay_ms, nactive, ndirty, nmuzzy);

	size_t base_allocated, base_resident, base_mapped, metadata_thp;
	base_stats_get(tsdn, arena->base, &base_allocated, &base_resident,
	    &base_mapped, &metadata_thp);

	arena_stats_lock(tsdn, &arena->stats);

	arena_stats_accum_zu(&astats->mapped, base_mapped
	    + arena_stats_read_zu(tsdn, &arena->stats, &arena->stats.mapped));
	arena_stats_accum_zu(&astats->retained,
	    extents_npages_get(&arena->extents_retained) << LG_PAGE);

	atomic_store_zu(&astats->extent_avail,
	    atomic_load_zu(&arena->extent_avail_cnt, ATOMIC_RELAXED),
	    ATOMIC_RELAXED);

	arena_stats_accum_u64(&astats->decay_dirty.npurge,
	    arena_stats_read_u64(tsdn, &arena->stats,
	    &arena->stats.decay_dirty.npurge));
	arena_stats_accum_u64(&astats->decay_dirty.nmadvise,
	    arena_stats_read_u64(tsdn, &arena->stats,
	    &arena->stats.decay_dirty.nmadvise));
	arena_stats_accum_u64(&astats->decay_dirty.purged,
	    arena_stats_read_u64(tsdn, &arena->stats,
	    &arena->stats.decay_dirty.purged));

	arena_stats_accum_u64(&astats->decay_muzzy.npurge,
	    arena_stats_read_u64(tsdn, &arena->stats,
	    &arena->stats.decay_muzzy.npurge));
	arena_stats_accum_u64(&astats->decay_muzzy.nmadvise,
	    arena_stats_read_u64(tsdn, &arena->stats,
	    &arena->stats.decay_muzzy.nmadvise));
	arena_stats_accum_u64(&astats->decay_muzzy.purged,
	    arena_stats_read_u64(tsdn, &arena->stats,
	    &arena->stats.decay_muzzy.purged));

	arena_stats_accum_zu(&astats->base, base_allocated);
	arena_stats_accum_zu(&astats->internal, arena_internal_get(arena));
	arena_stats_accum_zu(&astats->metadata_thp, metadata_thp);
	arena_stats_accum_zu(&astats->resident, base_resident +
	    (((atomic_load_zu(&arena->nactive, ATOMIC_RELAXED) +
	    extents_npages_get(&arena->extents_dirty) +
	    extents_npages_get(&arena->extents_muzzy)) << LG_PAGE)));

	for (szind_t i = 0; i < SC_NSIZES - SC_NBINS; i++) {
		uint64_t nmalloc = arena_stats_read_u64(tsdn, &arena->stats,
		    &arena->stats.lstats[i].nmalloc);
		arena_stats_accum_u64(&lstats[i].nmalloc, nmalloc);
		arena_stats_accum_u64(&astats->nmalloc_large, nmalloc);

		uint64_t ndalloc = arena_stats_read_u64(tsdn, &arena->stats,
		    &arena->stats.lstats[i].ndalloc);
		arena_stats_accum_u64(&lstats[i].ndalloc, ndalloc);
		arena_stats_accum_u64(&astats->ndalloc_large, ndalloc);

		uint64_t nrequests = arena_stats_read_u64(tsdn, &arena->stats,
		    &arena->stats.lstats[i].nrequests);
		arena_stats_accum_u64(&lstats[i].nrequests,
		    nmalloc + nrequests);
		arena_stats_accum_u64(&astats->nrequests_large,
		    nmalloc + nrequests);

		/* nfill == nmalloc for large currently. */
		arena_stats_accum_u64(&lstats[i].nfills, nmalloc);
		arena_stats_accum_u64(&astats->nfills_large, nmalloc);

		uint64_t nflush = arena_stats_read_u64(tsdn, &arena->stats,
		    &arena->stats.lstats[i].nflushes);
		arena_stats_accum_u64(&lstats[i].nflushes, nflush);
		arena_stats_accum_u64(&astats->nflushes_large, nflush);

		assert(nmalloc >= ndalloc);
		assert(nmalloc - ndalloc <= SIZE_T_MAX);
		size_t curlextents = (size_t)(nmalloc - ndalloc);
		lstats[i].curlextents += curlextents;
		arena_stats_accum_zu(&astats->allocated_large,
		    curlextents * sz_index2size(SC_NBINS + i));
	}

	for (pszind_t i = 0; i < SC_NPSIZES; i++) {
		size_t dirty, muzzy, retained, dirty_bytes, muzzy_bytes,
		    retained_bytes;
		dirty = extents_nextents_get(&arena->extents_dirty, i);
		muzzy = extents_nextents_get(&arena->extents_muzzy, i);
		retained = extents_nextents_get(&arena->extents_retained, i);
		dirty_bytes = extents_nbytes_get(&arena->extents_dirty, i);
		muzzy_bytes = extents_nbytes_get(&arena->extents_muzzy, i);
		retained_bytes =
		    extents_nbytes_get(&arena->extents_retained, i);

		atomic_store_zu(&estats[i].ndirty, dirty, ATOMIC_RELAXED);
		atomic_store_zu(&estats[i].nmuzzy, muzzy, ATOMIC_RELAXED);
		atomic_store_zu(&estats[i].nretained, retained, ATOMIC_RELAXED);
		atomic_store_zu(&estats[i].dirty_bytes, dirty_bytes,
		    ATOMIC_RELAXED);
		atomic_store_zu(&estats[i].muzzy_bytes, muzzy_bytes,
		    ATOMIC_RELAXED);
		atomic_store_zu(&estats[i].retained_bytes, retained_bytes,
		    ATOMIC_RELAXED);
	}

	arena_stats_unlock(tsdn, &arena->stats);

	/* tcache_bytes counts currently cached bytes. */
	atomic_store_zu(&astats->tcache_bytes, 0, ATOMIC_RELAXED);
	malloc_mutex_lock(tsdn, &arena->tcache_ql_mtx);
	cache_bin_array_descriptor_t *descriptor;
	ql_foreach(descriptor, &arena->cache_bin_array_descriptor_ql, link) {
		szind_t i = 0;
		for (; i < SC_NBINS; i++) {
			cache_bin_t *tbin = &descriptor->bins_small[i];
			arena_stats_accum_zu(&astats->tcache_bytes,
			    tbin->ncached * sz_index2size(i));
		}
		for (; i < nhbins; i++) {
			cache_bin_t *tbin = &descriptor->bins_large[i];
			arena_stats_accum_zu(&astats->tcache_bytes,
			    tbin->ncached * sz_index2size(i));
		}
	}
	malloc_mutex_prof_read(tsdn,
	    &astats->mutex_prof_data[arena_prof_mutex_tcache_list],
	    &arena->tcache_ql_mtx);
	malloc_mutex_unlock(tsdn, &arena->tcache_ql_mtx);

#define READ_ARENA_MUTEX_PROF_DATA(mtx, ind)				\
    malloc_mutex_lock(tsdn, &arena->mtx);				\
    malloc_mutex_prof_read(tsdn, &astats->mutex_prof_data[ind],		\
        &arena->mtx);							\
    malloc_mutex_unlock(tsdn, &arena->mtx);

	/* Gather per arena mutex profiling data. */
	READ_ARENA_MUTEX_PROF_DATA(large_mtx, arena_prof_mutex_large);
	READ_ARENA_MUTEX_PROF_DATA(extent_avail_mtx,
	    arena_prof_mutex_extent_avail)
	READ_ARENA_MUTEX_PROF_DATA(extents_dirty.mtx,
	    arena_prof_mutex_extents_dirty)
	READ_ARENA_MUTEX_PROF_DATA(extents_muzzy.mtx,
	    arena_prof_mutex_extents_muzzy)
	READ_ARENA_MUTEX_PROF_DATA(extents_retained.mtx,
	    arena_prof_mutex_extents_retained)
	READ_ARENA_MUTEX_PROF_DATA(decay_dirty.mtx,
	    arena_prof_mutex_decay_dirty)
	READ_ARENA_MUTEX_PROF_DATA(decay_muzzy.mtx,
	    arena_prof_mutex_decay_muzzy)
	READ_ARENA_MUTEX_PROF_DATA(base->mtx,
	    arena_prof_mutex_base)
#undef READ_ARENA_MUTEX_PROF_DATA

	nstime_copy(&astats->uptime, &arena->create_time);
	nstime_update(&astats->uptime);
	nstime_subtract(&astats->uptime, &arena->create_time);

	for (szind_t i = 0; i < SC_NBINS; i++) {
		for (unsigned j = 0; j < bin_infos[i].n_shards; j++) {
			bin_stats_merge(tsdn, &bstats[i],
			    &arena->bins[i].bin_shards[j]);
		}
	}
}